

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

int VP8IteratorProgress(VP8EncIterator *it,int delta)

{
  WebPPicture *pic;
  int iVar1;
  
  if (delta != 0) {
    pic = it->enc->pic;
    if (pic->progress_hook != (WebPProgressHook)0x0) {
      iVar1 = it->count_down0;
      if (iVar1 < 1) {
        iVar1 = it->percent0;
      }
      else {
        iVar1 = ((iVar1 - it->count_down) * delta) / iVar1 + it->percent0;
      }
      iVar1 = WebPReportProgress(pic,iVar1,&it->enc->percent);
      return iVar1;
    }
  }
  return 1;
}

Assistant:

int VP8IteratorProgress(const VP8EncIterator* const it, int delta) {
  VP8Encoder* const enc = it->enc;
  if (delta && enc->pic->progress_hook != NULL) {
    const int done = it->count_down0 - it->count_down;
    const int percent = (it->count_down0 <= 0)
                      ? it->percent0
                      : it->percent0 + delta * done / it->count_down0;
    return WebPReportProgress(enc->pic, percent, &enc->percent);
  }
  return 1;
}